

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack20_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  uVar2 = *(ulong *)in;
  auVar8._8_8_ = 0x1000000004;
  auVar8._0_8_ = 0x1000000004;
  auVar9._8_8_ = 0xf0000000ffff0;
  auVar9._0_8_ = 0xf0000000ffff0;
  auVar14._8_4_ = 0xfffff;
  auVar14._0_8_ = 0xfffff000fffff;
  auVar14._12_4_ = 0xfffff;
  auVar3 = vpmovsxbd_avx(ZEXT416(0x101c0814));
  uVar1 = in[4];
  *out = (uint)uVar2 & 0xfffff;
  auVar5 = vpinsrd_avx(auVar14,((uint)(uVar2 >> 0x20) & 0xff) << 0xc,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in + 2);
  auVar10 = vpsllvd_avx2(auVar6,auVar8);
  uVar4 = (uint)(*(ulong *)(in + 2) >> 0x20);
  auVar10 = vpand_avx(auVar10,auVar9);
  auVar7 = vpmovsxbd_avx(ZEXT416(0x4010100));
  auVar10 = vpunpcklqdq_avx(auVar5,auVar10);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5 = vpermt2d_avx512vl(auVar5,auVar7,auVar6);
  auVar6 = vpsrlvd_avx2(auVar5,auVar3);
  auVar5 = vpor_avx(auVar6,auVar10);
  auVar10 = vpand_avx(auVar14,auVar6);
  auVar10 = vpblendd_avx2(auVar5,auVar10,2);
  *(undefined1 (*) [16])(out + 1) = auVar10;
  out[5] = uVar4 >> 4 & 0xfffff;
  uVar2 = *(ulong *)(in + 5);
  out[6] = uVar4 >> 0x18 | (uVar1 & 0xfff) << 8;
  out[7] = uVar1 >> 0xc;
  uVar1 = in[9];
  out[8] = (uint)uVar2 & 0xfffff;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(in + 7);
  auVar6 = vpermt2d_avx512vl(auVar10,auVar7,auVar12);
  auVar10 = vpsllvd_avx2(auVar12,auVar8);
  auVar5 = vpinsrd_avx(auVar14,((uint)(uVar2 >> 0x20) & 0xff) << 0xc,0);
  auVar10 = vpand_avx(auVar10,auVar9);
  uVar4 = (uint)(*(ulong *)(in + 7) >> 0x20);
  auVar10 = vpunpcklqdq_avx(auVar5,auVar10);
  auVar6 = vpsrlvd_avx2(auVar6,auVar3);
  auVar5 = vpor_avx(auVar6,auVar10);
  auVar10 = vpand_avx(auVar14,auVar6);
  auVar10 = vpblendd_avx2(auVar5,auVar10,2);
  *(undefined1 (*) [16])(out + 9) = auVar10;
  out[0xd] = uVar4 >> 4 & 0xfffff;
  out[0xe] = uVar4 >> 0x18 | (uVar1 & 0xfff) << 8;
  uVar2 = *(ulong *)(in + 10);
  out[0xf] = uVar1 >> 0xc;
  uVar1 = in[0xe];
  out[0x10] = (uint)uVar2 & 0xfffff;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(in + 0xc);
  auVar7 = vpermt2d_avx512vl(auVar11,auVar7,auVar13);
  auVar10 = vpsllvd_avx2(auVar13,auVar8);
  auVar5 = vpinsrd_avx(auVar14,((uint)(uVar2 >> 0x20) & 0xff) << 0xc,0);
  auVar10 = vpand_avx(auVar10,auVar9);
  uVar4 = (uint)(*(ulong *)(in + 0xc) >> 0x20);
  auVar10 = vpunpcklqdq_avx(auVar5,auVar10);
  auVar3 = vpsrlvd_avx2(auVar7,auVar3);
  auVar5 = vpor_avx(auVar3,auVar10);
  auVar10 = vpand_avx(auVar14,auVar3);
  auVar10 = vpblendd_avx2(auVar5,auVar10,2);
  *(undefined1 (*) [16])(out + 0x11) = auVar10;
  out[0x15] = uVar4 >> 4 & 0xfffff;
  out[0x16] = uVar4 >> 0x18 | (uVar1 & 0xfff) << 8;
  out[0x17] = uVar1 >> 0xc;
  return in + 0xf;
}

Assistant:

const uint32_t *__fastunpack20_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 8)) << (20 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 20);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 16)) << (20 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 4)) << (20 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 20);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 12)) << (20 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 8)) << (20 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 20);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 16)) << (20 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 4)) << (20 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 20);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 12)) << (20 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 8)) << (20 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 20);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 16)) << (20 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 4)) << (20 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 20);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 12)) << (20 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  out++;

  return in;
}